

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vtestps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  undefined4 uVar4;
  long lVar5;
  
  if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).VEX.state != '\x01')
      ) || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    uVar4 = 0xffffffff;
    lVar5 = 0x924;
  }
  else {
    if (((pMyDisasm->Reserved_).REX.W_ == '\x01') || ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f')) {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    (pMyDisasm->Instruction).Category = 0x110000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vtestps",8);
    UVar1 = (pMyDisasm->Reserved_).VEX.L;
    uVar4 = 1;
    lVar5 = 0x1c8;
    if (UVar1 == '\0') {
      IVar2 = 0x6d;
      IVar3 = 4;
    }
    else {
      if (UVar1 != '\x01') goto LAB_00129c0e;
      IVar2 = 0x6e;
      IVar3 = 8;
    }
    (pMyDisasm->Reserved_).Register_ = IVar3;
    (pMyDisasm->Reserved_).MemDecoration = IVar2;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  }
LAB_00129c0e:
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar5 + -0x14) = uVar4;
  return;
}

Assistant:

void __bea_callspec__ vtestps_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if ((GV.REX.W_ == 1) || (GV.VEX.vvvv != 15)) {
        GV.ERROR_OPCODE = UD_;
      }
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vtestps");
      #endif
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg2_m128_xmm;
        GxEx(pMyDisasm);
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
        GV.MemDecoration = Arg2_m256_ymm;
        GxEx(pMyDisasm);
      }
      pMyDisasm->Operand1.AccessMode = READ;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}